

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZConsReader.cpp
# Opt level: O1

void __thiscall OpenMD::ZConsReader::ZConsReader(ZConsReader *this,SimInfo *info)

{
  pointer pcVar1;
  Globals *pGVar2;
  pointer ppZVar3;
  pointer ppZVar4;
  iterator __position;
  long *plVar5;
  ostream *poVar6;
  long *plVar7;
  ulong uVar8;
  uint uVar9;
  vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> stamp;
  string zconsFileName_;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  std::ifstream::ifstream(this);
  this->info_ = info;
  (this->allZmols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->allZmols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->allZmols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->fixedZmolData_).super__Vector_base<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fixedZmolData_).super__Vector_base<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fixedZmolData_).super__Vector_base<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = (info->finalConfigFileName_)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (info->finalConfigFileName_)._M_string_length);
  getPrefix(&local_90,&local_50);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar7;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::open((char *)this,(_Ios_Openmode)local_70);
  if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 5) == 0) {
    pGVar2 = this->info_->simParams_;
    ppZVar3 = (pGVar2->zconstraints_).
              super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppZVar4 = (pGVar2->zconstraints_).
              super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    std::vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::vector
              ((vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> *)&local_90,
               &pGVar2->zconstraints_);
    uVar9 = (uint)((ulong)((long)ppZVar3 - (long)ppZVar4) >> 3);
    if (0 < (int)uVar9) {
      uVar8 = 0;
      do {
        local_50._M_dataplus._M_p._0_4_ =
             *(int *)(*(long *)(local_90._M_dataplus._M_p + uVar8 * 8) + 0x94);
        __position._M_current =
             (this->allZmols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->allZmols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&this->allZmols_,__position,(int *)&local_50);
        }
        else {
          *__position._M_current = *(int *)(*(long *)(local_90._M_dataplus._M_p + uVar8 * 8) + 0x94)
          ;
          (this->allZmols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        uVar8 = uVar8 + 1;
      } while ((uVar9 & 0x7fffffff) != uVar8);
    }
    if (local_90._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_90._M_dataplus._M_p,
                      local_90.field_2._M_allocated_capacity - (long)local_90._M_dataplus._M_p);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"open ",5);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"error",5);
  std::endl<char,std::char_traits<char>>(poVar6);
  exit(1);
}

Assistant:

ZConsReader::ZConsReader(SimInfo* info) : info_(info) {
    std::string zconsFileName_ =
        getPrefix(info_->getFinalConfigFileName()) + ".fz";
    istream_.open(zconsFileName_.c_str());

    if (!istream_) {
      std::cerr << "open " << zconsFileName_ << "error" << std::endl;
      exit(1);
    }

    Globals* simParam              = info_->getSimParams();
    int nZconstraints              = simParam->getNZconsStamps();
    std::vector<ZConsStamp*> stamp = simParam->getZconsStamps();
    for (int i = 0; i < nZconstraints; i++) {
      allZmols_.push_back(stamp[i]->getMolIndex());
    }
  }